

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall
Liby::http::HttpClient::HttpClient(HttpClient *this,EventLoopGroup *group,string *host)

{
  undefined8 service;
  string *host_00;
  element_type *this_00;
  anon_class_8_1_8991fb9c local_90;
  Connector local_88;
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [40];
  string *host_local;
  EventLoopGroup *group_local;
  HttpClient *this_local;
  
  local_40._32_8_ = host;
  host_local = (string *)group;
  group_local = (EventLoopGroup *)this;
  std::__cxx11::string::string((string *)this);
  ReplyParser::ReplyParser(&this->parser_);
  std::__cxx11::
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::list(&this->requestLists_);
  std::__cxx11::
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::list(&this->sendReqeustLists_);
  std::shared_ptr<Liby::TcpClient>::shared_ptr(&this->http_client_);
  std::shared_ptr<Liby::Connection>::shared_ptr(&this->http_conn_);
  std::__cxx11::string::operator=((string *)this,(string *)local_40._32_8_);
  host_00 = host_local;
  service = local_40._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"80",&local_61);
  EventLoopGroup::creatTcpClient((EventLoopGroup *)local_40,host_00,(string *)service);
  std::shared_ptr<Liby::TcpClient>::operator=
            (&this->http_client_,(shared_ptr<Liby::TcpClient> *)local_40);
  std::shared_ptr<Liby::TcpClient>::~shared_ptr((shared_ptr<Liby::TcpClient> *)local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this_00 = std::__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->http_client_);
  local_90.this = this;
  std::function<void(std::shared_ptr<Liby::Connection>)>::
  function<Liby::http::HttpClient::HttpClient(Liby::EventLoopGroup&,std::__cxx11::string_const&)::__0,void>
            ((function<void(std::shared_ptr<Liby::Connection>)> *)&local_88,&local_90);
  TcpClient::onConnect(this_00,&local_88);
  std::function<void_(std::shared_ptr<Liby::Connection>)>::~function(&local_88);
  return;
}

Assistant:

HttpClient::HttpClient(EventLoopGroup &group, const std::string &host) {
    host_ = host;
    http_client_ = group.creatTcpClient(host, "80");
    http_client_->onConnect([this](ConnPtr conn) { handleConnection(conn); });
}